

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_showref.cpp
# Opt level: O1

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::BindShowQuery(Binder *this,ShowRef *ref)

{
  ClientContext *context;
  size_t __n;
  pointer pcVar1;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> _Var2;
  optional_ptr<duckdb::TableCatalogEntry,_true> table;
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> _Var3;
  idx_t index;
  int iVar4;
  Binder *this_00;
  type node;
  Allocator *allocator;
  ColumnDataCollection *this_01;
  pointer pCVar5;
  type op;
  reference pvVar6;
  string *psVar7;
  reference other;
  pointer pLVar8;
  _func_int **pp_Var9;
  long in_RDX;
  idx_t iVar10;
  long lVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  templated_unique_single_t collection;
  BaseTableColumnInfo result;
  templated_unique_single_t show;
  vector<duckdb::LogicalType,_true> return_types;
  ColumnDataAppendState append_state;
  shared_ptr<duckdb::Binder,_true> child_binder;
  BoundStatement plan;
  DataChunk output;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  return_names;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> local_2d0;
  Binder *local_2c8;
  BaseTableColumnInfo local_2c0;
  LogicalType local_2b0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_298;
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> local_280;
  undefined1 local_278 [24];
  undefined1 auStack_260 [8];
  element_type *local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250;
  undefined1 auStack_248 [16];
  undefined1 local_238 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_228;
  LogicalType local_218;
  undefined1 local_200 [8];
  element_type *local_1f8;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  string local_1b8;
  Value local_198;
  string local_158;
  undefined1 local_138 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_108;
  DataChunk local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_b0;
  string local_98;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  local_2c8 = (Binder *)ref;
  local_280._M_head_impl = (BoundTableRef *)this;
  CreateBinder((Binder *)local_138,(ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p,
               (optional_ptr<duckdb::Binder,_true>)ref,REGULAR_BINDER);
  this_00 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_138);
  node = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
                   ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
                    (in_RDX + 0x88));
  Bind((BoundStatement *)(local_138 + 0x10),this_00,node);
  local_278._0_8_ = local_278 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"column_name","");
  local_258 = (element_type *)auStack_248;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"column_type","");
  local_238._0_8_ = &local_228;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"null","");
  local_218._0_8_ = (long)&local_218 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"key","");
  local_1f8 = (element_type *)local_1e8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"default","");
  local_1d8[0] = local_1c8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"extra","");
  __l._M_len = 6;
  __l._M_array = (iterator)local_278;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_b0,__l,(allocator_type *)&local_f0);
  lVar11 = 0;
  do {
    if (local_1c8 + lVar11 != *(undefined1 **)((long)local_1d8 + lVar11)) {
      operator_delete(*(undefined1 **)((long)local_1d8 + lVar11));
    }
    lVar11 = lVar11 + -0x20;
  } while (lVar11 != -0xc0);
  LogicalType::LogicalType((LogicalType *)local_278,VARCHAR);
  LogicalType::LogicalType((LogicalType *)auStack_260,VARCHAR);
  LogicalType::LogicalType((LogicalType *)auStack_248,VARCHAR);
  LogicalType::LogicalType((LogicalType *)(local_238 + 8),VARCHAR);
  LogicalType::LogicalType(&local_218,VARCHAR);
  LogicalType::LogicalType((LogicalType *)local_200,VARCHAR);
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)local_278;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_298,__l_00,(allocator_type *)&local_f0);
  lVar11 = 0x78;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_278 + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  DataChunk::DataChunk(&local_f0);
  allocator = Allocator::Get((ClientContext *)(((string *)&local_2c8->context)->_M_dataplus)._M_p);
  DataChunk::Initialize(&local_f0,allocator,(vector<duckdb::LogicalType,_true> *)&local_298,0x800);
  context = (ClientContext *)(((string *)&local_2c8->context)->_M_dataplus)._M_p;
  this_01 = (ColumnDataCollection *)operator_new(0x70);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_278,
             &local_298);
  ColumnDataCollection::ColumnDataCollection
            (this_01,context,(vector<duckdb::LogicalType,_true> *)local_278,BUFFER_MANAGER_ALLOCATOR
            );
  local_2d0._M_head_impl = this_01;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_278);
  local_278._0_8_ = auStack_248;
  local_278._8_8_ = &DAT_00000001;
  local_278._16_8_ = 0;
  auStack_260 = (undefined1  [8])0x0;
  local_258 = (element_type *)CONCAT44(local_258._4_4_,0x3f800000);
  local_250._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  auStack_248._0_8_ = (__node_base_ptr)0x0;
  auStack_248[8] = INVALID;
  local_238._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_238._8_8_ = (pointer)0x0;
  local_228._vptr__Sp_counted_base = (_func_int **)0x0;
  pCVar5 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
           ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                         *)&local_2d0);
  ColumnDataCollection::InitializeAppend(pCVar5,(ColumnDataAppendState *)local_278);
  if (local_120.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_120.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    iVar10 = 0;
    do {
      op = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)(local_138 + 0x10));
      local_2c0 = FindBaseTableColumn(op,iVar10);
      index = local_f0.count;
      pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](&local_108,iVar10);
      if (local_2c0.table.ptr == (TableCatalogEntry *)0x0) {
        other = vector<duckdb::LogicalType,_true>::operator[]
                          ((vector<duckdb::LogicalType,_true> *)&local_120,iVar10);
        LogicalType::LogicalType(&local_2b0,other);
        pcVar1 = (pvVar6->_M_dataplus)._M_p;
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,pcVar1,pcVar1 + pvVar6->_M_string_length);
        Value::Value(&local_198,&local_158);
        DataChunk::SetValue(&local_f0,0,index,&local_198);
        Value::~Value(&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        LogicalType::ToString_abi_cxx11_(&local_98,&local_2b0);
        Value::Value(&local_198,(string *)&local_98);
        DataChunk::SetValue(&local_f0,1,index,&local_198);
        Value::~Value(&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        Value::Value(&local_198,"YES");
        DataChunk::SetValue(&local_f0,2,index,&local_198);
        Value::~Value(&local_198);
        LogicalType::LogicalType(&local_48,SQLNULL);
        Value::Value(&local_198,&local_48);
        DataChunk::SetValue(&local_f0,3,index,&local_198);
        Value::~Value(&local_198);
        LogicalType::~LogicalType(&local_48);
        LogicalType::LogicalType(&local_60,SQLNULL);
        Value::Value(&local_198,&local_60);
        DataChunk::SetValue(&local_f0,4,index,&local_198);
        Value::~Value(&local_198);
        LogicalType::~LogicalType(&local_60);
        LogicalType::LogicalType(&local_78,SQLNULL);
        Value::Value(&local_198,&local_78);
        DataChunk::SetValue(&local_f0,5,index,&local_198);
        Value::~Value(&local_198);
        LogicalType::~LogicalType(&local_78);
        LogicalType::~LogicalType(&local_2b0);
      }
      else {
        optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(&local_2c0.table);
        table.ptr = local_2c0.table.ptr;
        optional_ptr<const_duckdb::ColumnDefinition,_true>::CheckValid(&local_2c0.column);
        PragmaTableInfo::GetColumnInfo(table.ptr,local_2c0.column.ptr,&local_f0,index);
        optional_ptr<const_duckdb::ColumnDefinition,_true>::CheckValid(&local_2c0.column);
        psVar7 = ColumnDefinition::Name_abi_cxx11_(local_2c0.column.ptr);
        __n = pvVar6->_M_string_length;
        if ((__n != psVar7->_M_string_length) ||
           ((__n != 0 &&
            (iVar4 = bcmp((pvVar6->_M_dataplus)._M_p,(psVar7->_M_dataplus)._M_p,__n), iVar4 != 0))))
        {
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          pcVar1 = (pvVar6->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b8,pcVar1,pcVar1 + pvVar6->_M_string_length);
          Value::Value(&local_198,&local_1b8);
          DataChunk::SetValue(&local_f0,0,index,&local_198);
          Value::~Value(&local_198);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p);
          }
        }
      }
      local_f0.count = (long)(_Hash_node_base **)local_f0.count + 1;
      if ((_Hash_node_base *)local_f0.count == (_Hash_node_base *)0x800) {
        pCVar5 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                               *)&local_2d0);
        ColumnDataCollection::Append(pCVar5,(ColumnDataAppendState *)local_278,&local_f0);
        DataChunk::Reset(&local_f0);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < (ulong)(((long)local_120.
                                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_120.
                                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  pCVar5 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
           ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                         *)&local_2d0);
  ColumnDataCollection::Append(pCVar5,(ColumnDataAppendState *)local_278,&local_f0);
  local_198.type_._0_8_ = GenerateTableIndex(local_2c8);
  make_uniq<duckdb::LogicalColumnDataGet,unsigned_long,duckdb::vector<duckdb::LogicalType,true>&,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>
            ((duckdb *)&local_2b0,(unsigned_long *)&local_198,
             (vector<duckdb::LogicalType,_true> *)&local_298,
             (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              *)&local_2d0);
  pLVar8 = unique_ptr<duckdb::LogicalColumnDataGet,_std::default_delete<duckdb::LogicalColumnDataGet>,_true>
           ::operator->((unique_ptr<duckdb::LogicalColumnDataGet,_std::default_delete<duckdb::LogicalColumnDataGet>,_true>
                         *)&local_2b0);
  iVar10 = pLVar8->table_index;
  local_198.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_198 + 0x10U);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"__show_select","");
  BindContext::AddGenericBinding
            (&local_2c8->bind_context,iVar10,(string *)&local_198,&local_b0,
             (vector<duckdb::LogicalType,_true> *)&local_298);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_198.type_._0_8_ !=
      (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_198 + 0x10U)) {
    operator_delete((void *)local_198.type_._0_8_);
  }
  pp_Var9 = (_func_int **)operator_new(0x28);
  _Var3._M_head_impl = local_280._M_head_impl;
  *(undefined1 *)(pp_Var9 + 1) = 5;
  pp_Var9[2] = (_func_int *)0x0;
  *pp_Var9 = (_func_int *)&PTR__BoundTableFunction_024814a8;
  pp_Var9[3] = (_func_int *)local_2b0._0_8_;
  pp_Var9[4] = (_func_int *)0x0;
  (local_280._M_head_impl)->_vptr_BoundTableRef = pp_Var9;
  local_2b0._0_8_ =
       (tuple<duckdb::LogicalColumnDataGet_*,_std::default_delete<duckdb::LogicalColumnDataGet>_>)
       0x0;
  ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::~vector
            ((vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_> *)
             local_238);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_278);
  _Var2._M_head_impl = local_2d0._M_head_impl;
  if (local_2d0._M_head_impl != (ColumnDataCollection *)0x0) {
    ColumnDataCollection::~ColumnDataCollection(local_2d0._M_head_impl);
    operator_delete(_Var2._M_head_impl);
  }
  DataChunk::~DataChunk(&local_f0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_298);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_b0);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_108);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_120);
  if ((ClientContext *)local_138._16_8_ != (ClientContext *)0x0) {
    (**(code **)((long)(((enable_shared_from_this<duckdb::ClientContext> *)local_138._16_8_)->
                       __weak_this_).internal.
                       super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                8))();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
  }
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (__uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         _Var3._M_head_impl;
}

Assistant:

unique_ptr<BoundTableRef> Binder::BindShowQuery(ShowRef &ref) {
	// bind the child plan of the DESCRIBE statement
	auto child_binder = Binder::CreateBinder(context, this);
	auto plan = child_binder->Bind(*ref.query);

	// construct a column data collection with the result
	vector<string> return_names = {"column_name", "column_type", "null", "key", "default", "extra"};
	vector<LogicalType> return_types = {LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::VARCHAR,
	                                    LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::VARCHAR};
	DataChunk output;
	output.Initialize(Allocator::Get(context), return_types);

	auto collection = make_uniq<ColumnDataCollection>(context, return_types);
	ColumnDataAppendState append_state;
	collection->InitializeAppend(append_state);
	for (idx_t column_idx = 0; column_idx < plan.types.size(); column_idx++) {
		// check if we can trace the column to a base table so that we can figure out constraint information
		auto result = FindBaseTableColumn(*plan.plan, column_idx);
		idx_t row_index = output.size();
		auto &alias = plan.names[column_idx];
		if (result.table) {
			// we can! emit the information from the base table directly
			PragmaTableInfo::GetColumnInfo(*result.table, *result.column, output, row_index);
			// Override the base column name with the alias if one is specified.
			if (alias != result.column->Name()) {
				output.SetValue(0, row_index, Value(alias));
			}
		} else {
			// we cannot - read the type/name from the plan instead
			auto type = plan.types[column_idx];

			// "name", TypeId::VARCHAR
			output.SetValue(0, row_index, Value(alias));
			// "type", TypeId::VARCHAR
			output.SetValue(1, row_index, Value(type.ToString()));
			// "null", TypeId::VARCHAR
			output.SetValue(2, row_index, Value("YES"));
			// "pk", TypeId::BOOL
			output.SetValue(3, row_index, Value());
			// "dflt_value", TypeId::VARCHAR
			output.SetValue(4, row_index, Value());
			// "extra", TypeId::VARCHAR
			output.SetValue(5, row_index, Value());
		}

		output.SetCardinality(output.size() + 1);
		if (output.size() == STANDARD_VECTOR_SIZE) {
			collection->Append(append_state, output);
			output.Reset();
		}
	}
	collection->Append(append_state, output);

	auto show = make_uniq<LogicalColumnDataGet>(GenerateTableIndex(), return_types, std::move(collection));
	bind_context.AddGenericBinding(show->table_index, "__show_select", return_names, return_types);
	return make_uniq<BoundTableFunction>(std::move(show));
}